

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

int name2id(name_map *map,int max,char *name)

{
  int iVar1;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  int i;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    if (in_ESI <= local_24) {
      return -1;
    }
    iVar1 = strcmp(*(char **)(in_RDI + (long)local_24 * 0x10 + 8),in_RDX);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  return *(int *)(in_RDI + (long)local_24 * 0x10);
}

Assistant:

int name2id(const name_map* map, int max, const char *name)
{
	int i;

	for (i = 0; i < max; i++) {
		if (!strcmp(map[i].name, name)) {
			return map[i].id;
		}
	}

	// nothing match
	return -1;
}